

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_perftest.cc
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LoadStatus LVar3;
  uint uVar4;
  int64_t iVar5;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  vector<int,_std::allocator<int>_> times;
  int delta;
  string err;
  BuildLog log;
  uint *local_f8;
  iterator iStack_f0;
  int *local_e8;
  string local_d8;
  string local_b8;
  BuildLog local_98;
  
  local_f8 = (uint *)0x0;
  iStack_f0._M_current = (int *)0x0;
  local_e8 = (int *)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  bVar2 = WriteTestData(&local_b8);
  if (bVar2) {
    BuildLog::BuildLog(&local_98);
    paVar1 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"BuildLogPerfTest-tempfile","");
    LVar3 = BuildLog::Load(&local_98,&local_d8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (LVar3 != LOAD_ERROR) {
      BuildLog::~BuildLog(&local_98);
      iVar9 = 5;
      do {
        iVar5 = GetTimeMillis();
        BuildLog::BuildLog(&local_98);
        local_d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"BuildLogPerfTest-tempfile","");
        LVar3 = BuildLog::Load(&local_98,&local_d8,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (LVar3 == LOAD_ERROR) {
          main_cold_2();
          goto LAB_001056df;
        }
        iVar6 = GetTimeMillis();
        uVar4 = (int)iVar6 - (int)iVar5;
        local_d8._M_dataplus._M_p._0_4_ = uVar4;
        printf("%dms\n",(ulong)uVar4);
        if (iStack_f0._M_current == local_e8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_f8,iStack_f0,(int *)&local_d8);
        }
        else {
          *iStack_f0._M_current = (uint)local_d8._M_dataplus._M_p;
          iStack_f0._M_current = iStack_f0._M_current + 1;
        }
        BuildLog::~BuildLog(&local_98);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      uVar7 = (long)iStack_f0._M_current - (long)local_f8 >> 2;
      uVar8 = (ulong)*local_f8;
      uVar10 = uVar8;
      if ((uint *)iStack_f0._M_current == local_f8) {
        fVar13 = 0.0;
      }
      else {
        fVar13 = 0.0;
        lVar11 = 0;
        uVar12 = uVar8;
        do {
          uVar4 = local_f8[lVar11];
          uVar8 = uVar12;
          if ((int)uVar12 < (int)uVar4) {
            uVar8 = (ulong)uVar4;
          }
          if ((int)uVar4 < (int)uVar10) {
            uVar10 = (ulong)uVar4;
            uVar8 = uVar12;
          }
          fVar13 = fVar13 + (float)(int)uVar4;
          lVar11 = lVar11 + 1;
          uVar12 = uVar8;
        } while (uVar7 + (uVar7 == 0) != lVar11);
      }
      printf("min %dms  max %dms  avg %.1fms\n",SUB84((double)(fVar13 / (float)uVar7),0),uVar10,
             uVar8);
      unlink("BuildLogPerfTest-tempfile");
      iVar9 = 0;
      goto LAB_0010566d;
    }
    main_cold_3();
  }
  else {
    main_cold_1();
  }
LAB_001056df:
  iVar9 = 1;
LAB_0010566d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_f8 != (uint *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  return iVar9;
}

Assistant:

int main() {
  vector<int> times;
  string err;

  if (!WriteTestData(&err)) {
    fprintf(stderr, "Failed to write test data: %s\n", err.c_str());
    return 1;
  }

  {
    // Read once to warm up disk cache.
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
  }
  const int kNumRepetitions = 5;
  for (int i = 0; i < kNumRepetitions; ++i) {
    int64_t start = GetTimeMillis();
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
    int delta = (int)(GetTimeMillis() - start);
    printf("%dms\n", delta);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());

  unlink(kTestFilename);

  return 0;
}